

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaExporter.cpp
# Opt level: O3

void __thiscall Assimp::ColladaExporter::WriteControllerLibrary(ColladaExporter *this)

{
  ostream *poVar1;
  size_t pIndex;
  
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&this->field_0x38,(this->startstr)._M_dataplus._M_p,
                      (this->startstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"<library_controllers>",0x15);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  std::__cxx11::string::append((char *)&this->startstr);
  if (this->mScene->mNumMeshes != 0) {
    pIndex = 0;
    do {
      WriteController(this,pIndex);
      pIndex = pIndex + 1;
    } while (pIndex < this->mScene->mNumMeshes);
  }
  PopTag(this);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&this->field_0x38,(this->startstr)._M_dataplus._M_p,
                      (this->startstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"</library_controllers>",0x16);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  return;
}

Assistant:

void ColladaExporter::WriteControllerLibrary()
{
    mOutput << startstr << "<library_controllers>" << endstr;
    PushTag();
    
    for( size_t a = 0; a < mScene->mNumMeshes; ++a) {
        WriteController( a);
    }

    PopTag();
    mOutput << startstr << "</library_controllers>" << endstr;
}